

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O3

int uv_fs_poll_start(uv_fs_poll_t *handle,uv_fs_poll_cb cb,char *path,uint interval)

{
  uv_loop_t *loop_00;
  int iVar1;
  size_t sVar2;
  undefined8 *ptr;
  uint64_t uVar3;
  uint local_50;
  int local_4c;
  int err;
  size_t len;
  uv_loop_t *loop;
  poll_ctx *ctx;
  uint interval_local;
  char *path_local;
  uv_fs_poll_cb cb_local;
  uv_fs_poll_t *handle_local;
  
  iVar1 = uv_is_active((uv_handle_t *)handle);
  if (iVar1 == 0) {
    loop_00 = handle->loop;
    sVar2 = strlen(path);
    ptr = (undefined8 *)uv__calloc(1,sVar2 + 0x328);
    if (ptr == (undefined8 *)0x0) {
      handle_local._4_4_ = -0xc;
    }
    else {
      ptr[3] = loop_00;
      ptr[4] = cb;
      local_50 = interval;
      if (interval == 0) {
        local_50 = 1;
      }
      *(uint *)((long)ptr + 0xc) = local_50;
      uVar3 = uv_now(loop_00);
      ptr[2] = uVar3;
      *ptr = handle;
      memcpy(ptr + 100,path,sVar2 + 1);
      local_4c = uv_timer_init(loop_00,(uv_timer_t *)(ptr + 5));
      if (-1 < local_4c) {
        *(uint *)(ptr + 0x10) = *(uint *)(ptr + 0x10) | 0x10;
        if ((((*(uint *)(ptr + 0x10) & 8) != 0) &&
            (*(uint *)(ptr + 0x10) = *(uint *)(ptr + 0x10) & 0xfffffff7,
            (*(uint *)(ptr + 0x10) & 1) == 0)) && ((*(uint *)(ptr + 0x10) & 4) != 0)) {
          *(int *)(ptr[6] + 8) = *(int *)(ptr[6] + 8) + -1;
        }
        local_4c = uv_fs_stat(loop_00,(uv_fs_t *)(ptr + 0x18),(char *)(ptr + 100),poll_cb);
        if (-1 < local_4c) {
          if (handle->poll_ctx != (void *)0x0) {
            ptr[99] = handle->poll_ctx;
          }
          handle->poll_ctx = ptr;
          if (((handle->flags & 4) == 0) &&
             (handle->flags = handle->flags | 4, (handle->flags & 8) != 0)) {
            handle->loop->active_handles = handle->loop->active_handles + 1;
          }
          return 0;
        }
      }
      uv__free(ptr);
      handle_local._4_4_ = local_4c;
    }
  }
  else {
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_fs_poll_start(uv_fs_poll_t* handle,
                     uv_fs_poll_cb cb,
                     const char* path,
                     unsigned int interval) {
  struct poll_ctx* ctx;
  uv_loop_t* loop;
  size_t len;
  int err;

  if (uv_is_active((uv_handle_t*)handle))
    return 0;

  loop = handle->loop;
  len = strlen(path);
  ctx = uv__calloc(1, sizeof(*ctx) + len);

  if (ctx == NULL)
    return UV_ENOMEM;

  ctx->loop = loop;
  ctx->poll_cb = cb;
  ctx->interval = interval ? interval : 1;
  ctx->start_time = uv_now(loop);
  ctx->parent_handle = handle;
  memcpy(ctx->path, path, len + 1);

  err = uv_timer_init(loop, &ctx->timer_handle);
  if (err < 0)
    goto error;

  ctx->timer_handle.flags |= UV_HANDLE_INTERNAL;
  uv__handle_unref(&ctx->timer_handle);

  err = uv_fs_stat(loop, &ctx->fs_req, ctx->path, poll_cb);
  if (err < 0)
    goto error;

  if (handle->poll_ctx != NULL)
    ctx->previous = handle->poll_ctx;
  handle->poll_ctx = ctx;
  uv__handle_start(handle);

  return 0;

error:
  uv__free(ctx);
  return err;
}